

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

bool __thiscall ON_Layer::Write(ON_Layer *this,ON_BinaryArchive *file)

{
  ON_wString *this_00;
  ON_LayerPrivate *pOVar1;
  element_type *peVar2;
  undefined4 uVar3;
  bool bVar4;
  bool b;
  bool bVar5;
  Type component_type;
  ON__UINT16 OVar6;
  ON_3dmArchiveTableType OVar7;
  int iVar8;
  ON__UINT32 OVar9;
  ON_UUID *pOVar10;
  wchar_t *pwVar11;
  ON_ComponentManifest *pOVar12;
  ON_ComponentManifestItem *this_01;
  uint s;
  ON_wString name;
  ON_wString sublayer_name;
  ON_NameHash sublayer_name_hash;
  ON_UUID parent_layer_id;
  ON_RandomNumberGenerator rng;
  undefined1 auStack_a48 [64];
  ON_UUID local_a08;
  undefined1 local_9f8 [2504];
  
  bVar4 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0xf);
  if (!bVar4) {
    return false;
  }
  bVar4 = PersistentVisibility(this);
  b = PersistentLocking(this);
  iVar8 = b + 1;
  if (bVar4) {
    iVar8 = 0;
  }
  bVar5 = ON_BinaryArchive::WriteInt(file,iVar8);
  if (!bVar5) {
    return false;
  }
  bVar5 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,&this->super_ON_ModelComponent);
  if (((bVar5) && (bVar5 = ON_BinaryArchive::WriteInt(file,this->m_iges_level), bVar5)) &&
     (bVar5 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                        (file,Material,this->m_material_index), bVar5)) {
    bVar5 = ON_BinaryArchive::WriteInt(file,0);
    if (!bVar5) {
      return false;
    }
    bVar5 = ON_BinaryArchive::WriteColor(file,&this->m_color);
    if (bVar5) {
      bVar5 = ON_BinaryArchive::WriteShort(file,0);
      if (!bVar5) {
        return false;
      }
      bVar5 = ON_BinaryArchive::WriteShort(file,0);
      if (!bVar5) {
        return false;
      }
      bVar5 = ON_BinaryArchive::WriteDouble(file,0.0);
      if ((bVar5) && (bVar5 = ON_BinaryArchive::WriteDouble(file,1.0), bVar5)) {
        OVar7 = ON_BinaryArchive::Active3dmTable(file);
        if (((OVar7 == layer_table) &&
            ((iVar8 = ON_BinaryArchive::Archive3dmVersion(file), iVar8 < 5 &&
             (bVar5 = ON_ModelComponent::NameIsNotEmpty(&this->super_ON_ModelComponent), bVar5))))
           && (bVar5 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent), bVar5))
        {
          ON_ModelComponent::Name((ON_ModelComponent *)auStack_a48);
          pOVar10 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
          local_a08.Data1 = pOVar10->Data1;
          local_a08.Data2 = pOVar10->Data2;
          local_a08.Data3 = pOVar10->Data3;
          local_a08.Data4 = *&pOVar10->Data4;
          OVar6 = ON_CRC16(0,0x10,&local_a08);
          s = (uint)OVar6;
          ON_RandomNumberGenerator::ON_RandomNumberGenerator((ON_RandomNumberGenerator *)local_9f8);
          ON_RandomNumberGenerator::Seed((ON_RandomNumberGenerator *)local_9f8,s);
          iVar8 = 0;
          do {
            auStack_a48._20_4_ = iVar8;
            if ((short)s == 0) {
              do {
                OVar9 = ON_RandomNumberGenerator::RandomNumber
                                  ((ON_RandomNumberGenerator *)local_9f8);
                s = OVar9 / 0xffff + (OVar9 / 0xffff) * -0x10000 + OVar9;
              } while (s == 0);
            }
            this_00 = (ON_wString *)(auStack_a48 + 8);
            ON_wString::ON_wString(this_00);
            pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)auStack_a48);
            ON_wString::Format(this_00,L"%ls (%04x)",pwVar11,(ulong)(s & 0xffff));
            ON_NameHash::Create((ON_NameHash *)(auStack_a48 + 0x18),&ON_nil_uuid,this_00);
            pOVar12 = ON_BinaryArchive::Manifest(file);
            component_type = ON_ModelComponent::ComponentType(&this->super_ON_ModelComponent);
            this_01 = ON_ComponentManifest::ItemFromNameHash
                                (pOVar12,component_type,(ON_NameHash *)(auStack_a48 + 0x18));
            bVar5 = ON_ComponentManifestItem::IsUnset(this_01);
            if (bVar5) {
              ON_wString::operator=((ON_wString *)auStack_a48,(ON_wString *)(auStack_a48 + 8));
              pOVar12 = ON_BinaryArchive::Manifest(file);
              pOVar10 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
              ON_ComponentManifest::ChangeComponentNameHash
                        (pOVar12,*pOVar10,(ON_NameHash *)(auStack_a48 + 0x18));
              ON_wString::~ON_wString((ON_wString *)(auStack_a48 + 8));
              break;
            }
            OVar9 = ON_RandomNumberGenerator::RandomNumber((ON_RandomNumberGenerator *)local_9f8);
            uVar3 = auStack_a48._20_4_;
            s = (uint)((ulong)OVar9 * 0x800080008001 >> 0x2f);
            ON_wString::~ON_wString((ON_wString *)(auStack_a48 + 8));
            iVar8 = uVar3 + 1;
          } while (iVar8 != 100);
          bVar5 = ON_BinaryArchive::WriteString(file,(ON_wString *)auStack_a48);
          ON_wString::~ON_wString((ON_wString *)auStack_a48);
        }
        else {
          bVar5 = ON_BinaryArchive::WriteModelComponentName(file,&this->super_ON_ModelComponent);
        }
        if (((((bVar5) && (bVar4 = ON_BinaryArchive::WriteBool(file,bVar4), bVar4)) &&
             (bVar4 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                                (file,LinePattern,this->m_linetype_index), bVar4)) &&
            ((bVar4 = ON_BinaryArchive::WriteColor(file,&this->m_plot_color), bVar4 &&
             (bVar4 = ON_BinaryArchive::WriteDouble(file,this->m_plot_weight_mm), bVar4)))) &&
           (bVar4 = ON_BinaryArchive::WriteBool(file,b), bVar4)) {
          pOVar10 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
          bVar4 = ON_BinaryArchive::WriteUuid(file,pOVar10);
          if (bVar4) {
            pOVar10 = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
            local_9f8._0_8_ = *(undefined8 *)pOVar10;
            local_9f8._8_8_ = *(undefined8 *)pOVar10->Data4;
            bVar4 = ON_BinaryArchive::WriteUuid(file,(ON_UUID *)local_9f8);
            if (((bVar4) && (bVar4 = ON_BinaryArchive::WriteBool(file,this->m_bExpanded), bVar4)) &&
               ((bVar4 = ON_RenderingAttributes::Write(&this->m_rendering_attributes,file), bVar4 &&
                (bVar4 = ON_BinaryArchive::WriteUuid(file,&this->m_display_material_id), bVar4)))) {
              pOVar1 = this->m_private;
              if (pOVar1 != (ON_LayerPrivate *)0x0) {
                peVar2 = (pOVar1->m_custom_section_style).
                         super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                if (pOVar1->m_visible_in_new_details == false) {
                  bVar4 = ON_BinaryArchive::WriteChar(file,'\"');
                  if (!bVar4) {
                    return false;
                  }
                  if (this->m_private == (ON_LayerPrivate *)0x0) {
                    bVar4 = true;
                  }
                  else {
                    bVar4 = this->m_private->m_visible_in_new_details;
                  }
                  bVar4 = ON_BinaryArchive::WriteBool(file,bVar4);
                  if (!bVar4) {
                    return false;
                  }
                }
                if (peVar2 != (element_type *)0x0) {
                  bVar4 = ON_BinaryArchive::WriteChar(file,'#');
                  if (!bVar4) {
                    return false;
                  }
                  iVar8 = (*(peVar2->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[10])
                                    (peVar2);
                  if ((char)iVar8 == '\0') {
                    return false;
                  }
                }
              }
              bVar4 = ON_BinaryArchive::WriteChar(file,'\0');
              return bVar4;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_Layer::Write(
       ON_BinaryArchive& file // serialize definition to binary archive
     ) const
{
  int i;

  // 11 May 2023 S. Baer
  // Do not write a minor chunk version greater than 15. Chunk versions are actually
  // two values packed into a single unsigned char. The use of type codes for I/O
  // with layers makes it so the minor version isn't really necessary. Just stop at
  // a minor version of 15
  bool rc = file.Write3dmChunkVersion(1,15);
  while(rc)
  {
    // Save the visibility state this layer has when its parent
    // is visible ignoring current parent visibility value.
    bool bVisible = PersistentVisibility();

    // Save the locked state this layer has when its parent
    // is unlocked ignoring current parenting locked setting.
    const bool bLocked = PersistentLocking();

    // Save OBSOLETE mode value so we don't break file format
    if ( bVisible )
      i = 0; // "normal" layer mode
    else if ( bLocked )
      i = 2; // "locked" layer mode
    else
      i = 1; // "hidden" layer mode

    rc = file.WriteInt( i );
    if (!rc) break;

    rc = file.Write3dmReferencedComponentIndex( *this );
    if (!rc) break;

    rc = file.WriteInt( m_iges_level );
    if (!rc) break;

    rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::RenderMaterial, m_material_index );
    if (!rc) break;

    // Starting with version 200312110, this value is zero.  For files written
    // with earlier versions, the number was a "model index" value that was
    // set to something >= 1, but never used.  We have to continue to 
    // read/write an integer here so that old/new versions of opennurbs can
    // read files written by new/old versions.
    i = 0;
    rc = file.WriteInt( i );
    if (!rc) break;

    rc = file.WriteColor( m_color );
    if (!rc) break;
    
    {
      // OBSOLETE LINE STYLE if ( rc ) rc = file.WriteLineStyle( LineStyle() );
      // Starting with version 200503170, this section is "officially" not used.
      // Prior to that, it was old ON_LineStyle information that has
      // never been used.
      short s = 0;
      if (rc) rc = file.WriteShort(s);    // default pattern
      if (rc) rc = file.WriteShort(s);    // default pattern index
      if (rc) rc = file.WriteDouble(0.0); // default thickness
      if (rc) rc = file.WriteDouble(1.0); // default scale
    }
    if (!rc) break;

    if (
      file.Active3dmTable() == ON_3dmArchiveTableType::layer_table
      && file.Archive3dmVersion() <= 4
      && NameIsNotEmpty()
      && ParentIdIsNotNil()
      )
    {
      ON_wString name = Name();
      // In V4 there are no parent layers and all V4 layer names must be unique.
      // Since layers can be written in any order, we cannot know if there will
      // eventually be a parent layer using the same name as this child layer.
      // So, child layer names get a hash appended to insure they are unique.
      ON_UUID parent_layer_id = ParentId();
      ON__UINT16 hash = ON_CRC16(0, sizeof(parent_layer_id), &parent_layer_id);
      ON_RandomNumberGenerator rng;
      rng.Seed(hash);
      for (int attempt_count = 0; attempt_count < 100; attempt_count++)
      {
        while ( 0 == hash )
          hash = (ON__UINT16)(rng.RandomNumber() % 0xFFFFU);
        ON_wString sublayer_name;
        sublayer_name.Format(L"%ls (%04x)", static_cast<const wchar_t*>(name),hash);
        
        // Use ON_nil_uuid ast the parent id because we need a name that is uniques
        // as a "top level" layer name for V4 files.
        const ON_NameHash sublayer_name_hash = ON_NameHash::Create(ON_nil_uuid,sublayer_name);

        if ( file.Manifest().ItemFromNameHash(ComponentType(), sublayer_name_hash).IsUnset() )
        {
          // have a unique name
          name = sublayer_name;
          const_cast< ON_ComponentManifest& >(file.Manifest()).ChangeComponentNameHash(Id(), sublayer_name_hash);
          break;
        }
        hash = (ON__UINT16)(rng.RandomNumber() % 0xFFFFU);
      }
      rc = file.WriteString( name );
    }
    else
    {
      rc = file.WriteModelComponentName(*this);
    }

    if (!rc) break;

    // 1.1 fields
    rc = file.WriteBool(bVisible);
    if (!rc) break;

    // 1.2 field
    rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, m_linetype_index );
    if (!rc) break;

    // 1.3 field - 23 March 2005 Dale Lear
    rc = file.WriteColor( m_plot_color);
    if (!rc) break;
    rc = file.WriteDouble( m_plot_weight_mm);
    if (!rc) break;

    // 1.4 field - 3 May 2005 Dale Lear 
    //           - locked and visible are independent settings
    rc = file.WriteBool( bLocked );
    if (!rc) break;

    // 1.5 field
    rc = file.WriteUuid( Id() );
    if (!rc) break;

    // 1.6 field
    ON_UUID parent_layer_id = ParentLayerId();
    rc = file.WriteUuid( parent_layer_id );
    if (!rc) break;

    // 1.6 field
    rc = file.WriteBool( m_bExpanded );
    if (!rc) break;

    // 1.7 field - added 6 June 2006
    rc = m_rendering_attributes.Write(file);
    if (!rc) break;

    // 1.8 field - added 19 Sep 2006
    rc = file.WriteUuid(m_display_material_id);
    if (!rc) break;

    // 1.10 field - added 29 Sep 2021
    // using ON_3dmObjectAttributes inspired technique for writing only
    // non-default values to 3dm files
    unsigned char c = 0;

    // selective clipping (1.10)
    //{
    //  bool forAllClippingPlanes = true;
    //  bool forNoClippingPlanes = false;
    //  ON_UuidList selectiveList;
    //  bool isParticipationList = true;
    //  GetClipParticipation(forAllClippingPlanes, forNoClippingPlanes, selectiveList, isParticipationList);
    //  // only write selective clipping data if it is not default
    //  if (false == forAllClippingPlanes || true == forNoClippingPlanes || selectiveList.Count() > 0)
    //  {
    //    c = ON_LayerTypeCodes::SelectiveClippingData;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteBool(forNoClippingPlanes);
    //    if (!rc) break;
    //    rc = selectiveList.Write(file);
    //    if (!rc) break;
    //  }
    //}

    // 23 April 2023 S. Baer
    // Stop writing individual section attributes. All section attribute IO has been
    // moved to writing an ON_SectionStyle instance
    // section hatch (1.11)
    const ON_SectionStyle* section_style = CustomSectionStyle();
    //if (section_style)
    //{
    //  if (section_style->HatchIndex() != ON_UNSET_INT_INDEX)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchIndex;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, section_style->HatchIndex());
    //    if (!rc) break;
    //  }
    //  if (section_style->HatchScale() != 1.0)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchScale;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteDouble(section_style->HatchScale());
    //    if (!rc) break;
    //  }
    //  if (section_style->HatchRotation() != 0.0)
    //  {
    //    c = ON_LayerTypeCodes::SectionHatchRotation;
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteDouble(section_style->HatchRotation());
    //    if (!rc) break;
    //  }

    //  // section fill (1.12)
    //  if (section_style->SectionFillRule() != ON::SectionFillRule::ClosedCurves)
    //  {
    //    c = ON_LayerTypeCodes::SectionFillRule; //32
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = file.WriteChar((unsigned char)section_style->SectionFillRule());
    //    if (!rc) break;
    //  }
    //}

    // custom linetype (1.13)
    // 17 Feb 2023 S. Baer
    // Custom linetypes were an experiment that ended up making the UI more complicated
    // than necessary. Do not write any custom linetype data into the 3dm file.
    //{
    //  const ON_Linetype* linetype = CustomLinetype();
    //  if (linetype)
    //  {
    //    c = ON_LayerTypeCodes::CustomLinetype; // 33
    //    rc = file.WriteChar(c);
    //    if (!rc) break;
    //    rc = linetype->Write(file);
    //    if (!rc) break;
    //  }
    //}

    // visible in new detail (1.14)
    if (PerViewportIsVisibleInNewDetails() != DefaultLayerPrivate.m_visible_in_new_details)
    {
      c = ON_LayerTypeCodes::PerViewportIsVisibleInNewDetails; //34
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(PerViewportIsVisibleInNewDetails());
      if (!rc) break;
    }

    if (section_style)
    {
      c = ON_LayerTypeCodes::CustomSectionStyle; //35
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = section_style->Write(file);
      if (!rc) break;
    }

    //if (m_private && false == m_private->m_clipplane_list_is_participation)
    //{
    //  c = ON_LayerTypeCodes::SelectiveClippingListType; //36
    //  rc = file.WriteChar(c);
    //  if (!rc) break;
    //  rc = file.WriteBool(m_private->m_clipplane_list_is_participation);
    //  if (!rc) break;
    //}

    // 0 indicates end of new non-default attributes
    c = 0;
    rc = file.WriteChar(c);

    break;
  }

  return rc;
}